

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testInvalidSliceStaticNoParams(void)

{
  RepeatedField<long> *pRVar1;
  RepeatedField<bool> *this;
  uint uVar2;
  uint uVar3;
  Rep *pRVar4;
  ulong uVar5;
  bool bVar6;
  FeatureType *pFVar7;
  ArrayFeatureType *pAVar8;
  long *plVar9;
  FeatureDescription *pFVar10;
  NeuralNetworkLayer *pNVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar12;
  void *pvVar13;
  SliceStaticLayerParams *pSVar14;
  bool *pbVar15;
  ostream *poVar16;
  string *psVar17;
  long lVar18;
  undefined8 *puVar19;
  int iVar20;
  RepeatedPtrField<CoreML::Specification::FeatureDescription> *pRVar21;
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this_00;
  uint32_t size;
  uint uVar22;
  Arena *pAVar23;
  Model m;
  Result res5;
  Result res4;
  Result res3;
  Result res2;
  Result res1;
  Model local_120;
  Result local_f0;
  Result local_c8;
  Result local_a0;
  Result local_78;
  Result local_50;
  
  CoreML::Specification::Model::Model(&local_120,(Arena *)0x0,false);
  if (local_120.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_120.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((local_120.description_)->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b7a46:
    pRVar21 = &(local_120.description_)->input_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar20 = ((local_120.description_)->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001b7a46;
    ((local_120.description_)->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar13 = pRVar4->elements[iVar20];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"input",puVar19);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar2] = 3;
  uVar22 = uVar2 + 1;
  (pAVar8->shape_).current_size_ = uVar22;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar22 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar22] = 5;
  uVar22 = uVar2 + 2;
  (pAVar8->shape_).current_size_ = uVar22;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar22 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar22] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (local_120.description_ == (ModelDescription *)0x0) {
    pAVar23 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_120.description_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ModelDescription>
                   (pAVar23);
  }
  pRVar4 = ((local_120.description_)->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b7bb2:
    pRVar21 = &(local_120.description_)->output_;
    pFVar10 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureDescription>
                        ((pRVar21->super_RepeatedPtrFieldBase).arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&pRVar21->super_RepeatedPtrFieldBase,pFVar10);
  }
  else {
    iVar20 = ((local_120.description_)->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001b7bb2;
    ((local_120.description_)->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar13 = pRVar4->elements[iVar20];
  }
  puVar19 = (undefined8 *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
    puVar19 = (undefined8 *)*puVar19;
  }
  google::protobuf::internal::ArenaStringPtr::
  Set<google::protobuf::internal::ArenaStringPtr::EmptyDefault>
            ((ArenaStringPtr *)((long)pvVar13 + 0x10),"output",puVar19);
  if (*(long *)((long)pvVar13 + 0x20) == 0) {
    pAVar23 = (Arena *)(*(ulong *)((long)pvVar13 + 8) & 0xfffffffffffffffc);
    if ((*(ulong *)((long)pvVar13 + 8) & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pFVar7 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::FeatureType>
                       (pAVar23);
    *(FeatureType **)((long)pvVar13 + 0x20) = pFVar7;
  }
  pFVar7 = *(FeatureType **)((long)pvVar13 + 0x20);
  if (pFVar7->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar7);
    pFVar7->_oneof_case_[0] = 5;
    uVar5 = (pFVar7->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pAVar8 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::ArrayFeatureType>
                       (pAVar23);
    (pFVar7->Type_).multiarraytype_ = pAVar8;
  }
  pAVar8 = (pFVar7->Type_).multiarraytype_;
  pRVar1 = &pAVar8->shape_;
  uVar2 = (pAVar8->shape_).current_size_;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar2] = 3;
  uVar22 = uVar2 + 1;
  (pAVar8->shape_).current_size_ = uVar22;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar22 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar22] = 5;
  uVar22 = uVar2 + 2;
  (pAVar8->shape_).current_size_ = uVar22;
  uVar3 = (pAVar8->shape_).total_size_;
  if (uVar22 == uVar3) {
    google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
  }
  plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
  plVar9[uVar22] = 2;
  pRVar1->current_size_ = uVar2 + 3;
  if (local_120._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_120);
    local_120._oneof_case_[0] = 500;
    pAVar23 = (Arena *)(local_120.super_MessageLite._internal_metadata_.ptr_ & 0xfffffffffffffffc);
    if ((local_120.super_MessageLite._internal_metadata_.ptr_ & 1U) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    local_120.Type_.neuralnetwork_ =
         google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetwork>(pAVar23);
  }
  (local_120.Type_.neuralnetworkregressor_)->arrayinputshapemapping_ = 1;
  pRVar4 = (((RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
            &(local_120.Type_.pipeline_)->models_)->super_RepeatedPtrFieldBase).rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b7d39:
    this_00 = (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)
              &(local_120.Type_.pipeline_)->models_;
    pNVar11 = google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::NeuralNetworkLayer>
                        ((this_00->super_RepeatedPtrFieldBase).arena_);
    pNVar11 = (NeuralNetworkLayer *)
              google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        ((RepeatedPtrFieldBase *)this_00,pNVar11);
  }
  else {
    iVar20 = (local_120.Type_.treeensembleregressor_)->postevaluationtransform_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001b7d39;
    (local_120.Type_.treeensembleregressor_)->postevaluationtransform_ = iVar20 + 1;
    pNVar11 = (NeuralNetworkLayer *)pRVar4->elements[iVar20];
  }
  pRVar4 = (pNVar11->input_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b7d71:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->input_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->input_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar20 = (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001b7d71;
    (pNVar11->input_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar13 = pRVar4->elements[iVar20];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3cb973);
  pRVar4 = (pNVar11->output_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 == (Rep *)0x0) {
LAB_001b7dc1:
    pbVar12 = google::protobuf::Arena::Create<std::__cxx11::string>
                        ((pNVar11->output_).super_RepeatedPtrFieldBase.arena_);
    pvVar13 = google::protobuf::internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                        (&(pNVar11->output_).super_RepeatedPtrFieldBase,pbVar12);
  }
  else {
    iVar20 = (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_;
    if (pRVar4->allocated_size <= iVar20) goto LAB_001b7dc1;
    (pNVar11->output_).super_RepeatedPtrFieldBase.current_size_ = iVar20 + 1;
    pvVar13 = pRVar4->elements[iVar20];
  }
  std::__cxx11::string::_M_replace((ulong)pvVar13,0,*(char **)((long)pvVar13 + 8),0x3dece7);
  if (pNVar11->_oneof_case_[0] != 0x3e3) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pNVar11);
    pNVar11->_oneof_case_[0] = 0x3e3;
    uVar5 = (pNVar11->super_MessageLite)._internal_metadata_.ptr_;
    pAVar23 = (Arena *)(uVar5 & 0xfffffffffffffffc);
    if ((uVar5 & 1) != 0) {
      pAVar23 = *(Arena **)pAVar23;
    }
    pSVar14 = google::protobuf::Arena::
              CreateMaybeMessage<CoreML::Specification::SliceStaticLayerParams>(pAVar23);
    (pNVar11->layer_).slicestatic_ = pSVar14;
  }
  pSVar14 = (SliceStaticLayerParams *)(pNVar11->layer_).gru_;
  this = &pSVar14->endmasks_;
  uVar2 = (pSVar14->endmasks_).current_size_;
  uVar3 = (pSVar14->endmasks_).total_size_;
  if (uVar2 == uVar3) {
    google::protobuf::RepeatedField<bool>::Reserve(this,uVar3 + 1);
  }
  pbVar15 = google::protobuf::RepeatedField<bool>::elements(this);
  pbVar15[uVar2] = true;
  this->current_size_ = uVar2 + 1;
  CoreML::validate<(MLModelType)500>(&local_50,&local_120);
  bVar6 = CoreML::Result::good(&local_50);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157a);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res1).good())",0x10);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  }
  else {
    psVar17 = CoreML::Result::message_abi_cxx11_(&local_50);
    lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8ddc,0);
    if (lVar18 != -1) {
      pRVar1 = &pSVar14->beginids_;
      uVar2 = (pSVar14->beginids_).current_size_;
      uVar3 = (pSVar14->beginids_).total_size_;
      if (uVar2 == uVar3) {
        google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
      }
      plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
      plVar9[uVar2] = 0;
      pRVar1->current_size_ = uVar2 + 1;
      CoreML::validate<(MLModelType)500>(&local_78,&local_120);
      bVar6 = CoreML::Result::good(&local_78);
      if (bVar6) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                   ,0x68);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
        poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1580);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
        std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res2).good())",0x10);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar16," was false, expected true.",0x1a);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
LAB_001b82c2:
        std::ostream::put((char)poVar16);
        iVar20 = 1;
        std::ostream::flush();
      }
      else {
        psVar17 = CoreML::Result::message_abi_cxx11_(&local_78);
        lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8e2d,0);
        if (lVar18 == -1) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1581);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16,"res2.message().find(\"End IDs\") != std::string::npos",0x33);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
          goto LAB_001b82c2;
        }
        pRVar1 = &pSVar14->endids_;
        uVar2 = (pSVar14->endids_).current_size_;
        uVar3 = (pSVar14->endids_).total_size_;
        if (uVar2 == uVar3) {
          google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
        }
        plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
        plVar9[uVar2] = 5;
        pRVar1->current_size_ = uVar2 + 1;
        CoreML::validate<(MLModelType)500>(&local_a0,&local_120);
        bVar6 = CoreML::Result::good(&local_a0);
        if (bVar6) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                     ,0x68);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
          poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1586);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res3).good())",0x10);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar16," was false, expected true.",0x1a);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
          std::ostream::put((char)poVar16);
          iVar20 = 1;
          std::ostream::flush();
        }
        else {
          psVar17 = CoreML::Result::message_abi_cxx11_(&local_a0);
          lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8e7a,0);
          if (lVar18 == -1) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                       ,0x68);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
            poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1587);
            std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16,"res3.message().find(\"Strides\") != std::string::npos",0x33);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar16," was false, expected true.",0x1a);
            iVar20 = 1;
            std::endl<char,std::char_traits<char>>(poVar16);
          }
          else {
            pRVar1 = &pSVar14->strides_;
            uVar2 = (pSVar14->strides_).current_size_;
            uVar3 = (pSVar14->strides_).total_size_;
            if (uVar2 == uVar3) {
              google::protobuf::RepeatedField<long>::Reserve(pRVar1,uVar3 + 1);
            }
            plVar9 = google::protobuf::RepeatedField<long>::elements(pRVar1);
            plVar9[uVar2] = 1;
            pRVar1->current_size_ = uVar2 + 1;
            CoreML::validate<(MLModelType)500>(&local_c8,&local_120);
            bVar6 = CoreML::Result::good(&local_c8);
            if (bVar6) {
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                         ,0x68);
              std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
              poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158c);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
              std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res4).good())",0x10);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar16," was false, expected true.",0x1a);
LAB_001b85da:
              iVar20 = 1;
              std::endl<char,std::char_traits<char>>(poVar16);
            }
            else {
              psVar17 = CoreML::Result::message_abi_cxx11_(&local_c8);
              lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8ec7,0);
              if (lVar18 == -1) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x68);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x158d);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16,"res4.message().find(\"Begin masks\") != std::string::npos",0x37)
                ;
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16," was false, expected true.",0x1a);
                goto LAB_001b85da;
              }
              CoreML::Specification::SliceStaticLayerParams::add_beginmasks(pSVar14,true);
              this->current_size_ = 0;
              CoreML::validate<(MLModelType)500>(&local_f0,&local_120);
              bVar6 = CoreML::Result::good(&local_f0);
              if (bVar6) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,
                           "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                           ,0x68);
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1593);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar16,"!((res5).good())",0x10);
                std::__ostream_insert<char,std::char_traits<char>>
                          (poVar16," was false, expected true.",0x1a);
LAB_001b8698:
                iVar20 = 1;
                std::endl<char,std::char_traits<char>>(poVar16);
              }
              else {
                psVar17 = CoreML::Result::message_abi_cxx11_(&local_f0);
                iVar20 = 0;
                lVar18 = std::__cxx11::string::find((char *)psVar17,0x3b8f1c,0);
                if (lVar18 == -1) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
                             ,0x68);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
                  poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x1594);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16,"res5.message().find(\"End masks\") != std::string::npos",0x35)
                  ;
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar16," was false, expected true.",0x1a);
                  goto LAB_001b8698;
                }
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_f0.m_message._M_dataplus._M_p != &local_f0.m_message.field_2) {
                operator_delete(local_f0.m_message._M_dataplus._M_p,
                                local_f0.m_message.field_2._M_allocated_capacity + 1);
              }
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8.m_message._M_dataplus._M_p != &local_c8.m_message.field_2) {
              operator_delete(local_c8.m_message._M_dataplus._M_p,
                              local_c8.m_message.field_2._M_allocated_capacity + 1);
            }
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0.m_message._M_dataplus._M_p != &local_a0.m_message.field_2) {
          operator_delete(local_a0.m_message._M_dataplus._M_p,
                          local_a0.m_message.field_2._M_allocated_capacity + 1);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78.m_message._M_dataplus._M_p != &local_78.m_message.field_2) {
        operator_delete(local_78.m_message._M_dataplus._M_p,
                        local_78.m_message.field_2._M_allocated_capacity + 1);
      }
      goto LAB_001b871d;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x68);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar16 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x157b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar16,"res1.message().find(\"Begin IDs\") != std::string::npos",0x35);
    std::__ostream_insert<char,std::char_traits<char>>(poVar16," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar16 + -0x18) + (char)poVar16);
  }
  std::ostream::put((char)poVar16);
  iVar20 = 1;
  std::ostream::flush();
LAB_001b871d:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.m_message._M_dataplus._M_p != &local_50.m_message.field_2) {
    operator_delete(local_50.m_message._M_dataplus._M_p,
                    local_50.m_message.field_2._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_120);
  return iVar20;
}

Assistant:

int testInvalidSliceStaticNoParams() {

    Specification::Model m;

    auto *in = m.mutable_description()->add_input();
    in->set_name("input");
    auto *inShape = in->mutable_type()->mutable_multiarraytype();
    inShape->add_shape(3);
    inShape->add_shape(5);
    inShape->add_shape(2);

    auto *out = m.mutable_description()->add_output();
    out->set_name("output");
    auto *outShape = out->mutable_type()->mutable_multiarraytype();
    outShape->add_shape(3);
    outShape->add_shape(5);
    outShape->add_shape(2);

    const auto nn = m.mutable_neuralnetwork();
    nn->set_arrayinputshapemapping(Specification::NeuralNetworkMultiArrayShapeMapping::EXACT_ARRAY_MAPPING);

    auto *layers = nn->add_layers();
    layers->add_input("input");
    layers->add_output("output");

    // missing required parameters

    auto* params = layers->mutable_slicestatic();
    params->add_endmasks(true);

    Result res1 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res1);
    ML_ASSERT(res1.message().find("Begin IDs") != std::string::npos);

    params->add_beginids(0);

    Result res2 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res2);
    ML_ASSERT(res2.message().find("End IDs") != std::string::npos);

    params->add_endids(5);

    Result res3 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res3);
    ML_ASSERT(res3.message().find("Strides") != std::string::npos);

    params->add_strides(1);

    Result res4 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res4);
    ML_ASSERT(res4.message().find("Begin masks") != std::string::npos);

    params->add_beginmasks(true);
    params->clear_endmasks();

    Result res5 = validate<MLModelType_neuralNetwork>(m);
    ML_ASSERT_BAD(res5);
    ML_ASSERT(res5.message().find("End masks") != std::string::npos);

    return 0;

}